

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

char * buttonSlots(WizardButton which)

{
  WizardButton which_local;
  char *local_8;
  
  switch(which) {
  case BackButton:
    local_8 = "1back()";
    break;
  case NextButton:
  case CommitButton:
    local_8 = "1next()";
    break;
  case FinishButton:
    local_8 = "1accept()";
    break;
  case CancelButton:
    local_8 = "1reject()";
    break;
  case HelpButton:
    local_8 = "2helpRequested()";
    break;
  case NoButton:
  case CustomButton1:
  case CustomButton2:
  case CustomButton3:
  case NButtons:
  default:
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const char * buttonSlots(QWizard::WizardButton which)
{
    switch (which) {
    case QWizard::BackButton:
        return SLOT(back());
    case QWizard::NextButton:
    case QWizard::CommitButton:
        return SLOT(next());
    case QWizard::FinishButton:
        return SLOT(accept());
    case QWizard::CancelButton:
        return SLOT(reject());
    case QWizard::HelpButton:
        return SIGNAL(helpRequested());
    case QWizard::CustomButton1:
    case QWizard::CustomButton2:
    case QWizard::CustomButton3:
    case QWizard::Stretch:
    case QWizard::NoButton:
        Q_UNREACHABLE();
    };
    return nullptr;
}